

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_pcm_s24_to_f32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_uint64 mVar1;
  ma_uint8 *src_s24;
  byte *pbVar2;
  
  if (count != 0) {
    pbVar2 = (byte *)((long)src + 2);
    mVar1 = 0;
    do {
      *(float *)((long)dst + mVar1 * 4) =
           (float)((int)((uint)*pbVar2 << 0x18 | (uint)*(ushort *)(pbVar2 + -2) << 8) >> 8) *
           1.1920929e-07;
      mVar1 = mVar1 + 1;
      pbVar2 = pbVar2 + 3;
    } while (count != mVar1);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_s24_to_f32__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    float* dst_f32 = (float*)dst;
    const ma_uint8* src_s24 = (const ma_uint8*)src;

    ma_uint64 i;
    for (i = 0; i < count; i += 1) {
        float x = (float)(((ma_int32)(((ma_uint32)(src_s24[i*3+0]) << 8) | ((ma_uint32)(src_s24[i*3+1]) << 16) | ((ma_uint32)(src_s24[i*3+2])) << 24)) >> 8);

#if 0
        /* The accurate way. */
        x = x + 8388608.0f;                 /* -8388608..8388607 to 0..16777215 */
        x = x * 0.00000011920929665621f;    /* 0..16777215 to 0..2 */
        x = x - 1;                          /* 0..2 to -1..1 */
#else
        /* The fast way. */
        x = x * 0.00000011920928955078125f; /* -8388608..8388607 to -1..0.999969482421875 */
#endif

        dst_f32[i] = x;
    }

    (void)ditherMode;
}